

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t sznet::detail::convert<int>(char *buf,int value)

{
  int iVar1;
  char *pcVar2;
  char *pcStack_20;
  int lsd;
  char *p;
  int i;
  int value_local;
  char *buf_local;
  
  pcVar2 = buf;
  p._0_4_ = value;
  do {
    pcStack_20 = pcVar2;
    iVar1 = (int)p % 10;
    p._0_4_ = (int)p / 10;
    pcVar2 = pcStack_20 + 1;
    *pcStack_20 = *(char *)(zero + iVar1);
  } while ((int)p != 0);
  if (value < 0) {
    *pcVar2 = '-';
    pcVar2 = pcStack_20 + 2;
  }
  pcStack_20 = pcVar2;
  *pcStack_20 = '\0';
  std::reverse<char*>(buf,pcStack_20);
  return (long)pcStack_20 - (long)buf;
}

Assistant:

size_t convert(char buf[], T value)
	{
		T i = value;
		char* p = buf;
		// 201 分别取数字 1 0 2
		do
		{
			int lsd = static_cast<int>(i % 10);
			i /= 10;
			*p++ = zero[lsd];
		} while (i != 0);
		// 判断 value 是否为负数
		if (value < 0)
		{
			*p++ = '-';
		}
		*p = '\0';
		// 反转
		std::reverse(buf, p);
		// 返回转换后的长度
		return p - buf;
	}